

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

_Bool arm_cpu_has_work(CPUState *cs)

{
  if (*(int *)(cs[1].tb_jmp_cache + 0xa4d) == 1) {
    return false;
  }
  return (cs->interrupt_request & 0x256) != 0;
}

Assistant:

static bool arm_cpu_has_work(CPUState *cs)
{
    ARMCPU *cpu = ARM_CPU(cs);

    return (cpu->power_state != PSCI_OFF)
        && cs->interrupt_request &
        (CPU_INTERRUPT_FIQ | CPU_INTERRUPT_HARD
         | CPU_INTERRUPT_VFIQ | CPU_INTERRUPT_VIRQ
         | CPU_INTERRUPT_EXITTB);
}